

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
* __thiscall
tinyusdz::lerp<std::array<tinyusdz::value::half,3ul>>
          (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          *a,vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
             *b,double t)

{
  pointer paVar1;
  half3 hVar2;
  ulong uVar3;
  long lVar4;
  ulong __new_size;
  half3 local_48;
  half3 local_40 [2];
  float local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (*(long *)(this + 8) - *(long *)this >> 1) * -0x5555555555555555;
  __new_size = ((long)(a->
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(a->
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 1) * -0x5555555555555555;
  if (uVar3 <= __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    std::
    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
    ::resize(__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      local_34 = (float)(1.0 - t);
      lVar4 = 0;
      do {
        paVar1 = (a->
                 super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        hVar2 = operator*(local_34,(half3 *)(*(long *)this + lVar4));
        local_40[0]._M_elems._0_4_ = hVar2._M_elems._0_4_;
        local_40[0]._M_elems[2].value = hVar2._M_elems[2].value;
        hVar2 = operator*((float)t,(half3 *)((long)&paVar1->_M_elems[0].value + lVar4));
        local_48._M_elems._0_4_ = hVar2._M_elems._0_4_;
        local_48._M_elems[2].value = hVar2._M_elems[2].value;
        hVar2 = operator+(local_40,&local_48);
        paVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(int *)((long)&paVar1->_M_elems[0].value + lVar4) = hVar2._M_elems._0_4_;
        *(uint16_t *)((long)&paVar1->_M_elems[2].value + lVar4) = hVar2._M_elems[2].value;
        lVar4 = lVar4 + 6;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}